

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBoolArray
               (bool *a,int n,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int n_local;
  bool *a_local;
  
  WriteArray<bool>(a,n,output);
  return;
}

Assistant:

void WireFormatLite::WriteBoolArray(const bool* a, int n,
                                    io::CodedOutputStream* output) {
  WriteArray<bool>(a, n, output);
}